

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle_decoder.cpp
# Opt level: O3

void __thiscall duckdb::RLEDecoder::InitializePage(RLEDecoder *this)

{
  uint64_t *puVar1;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> _Var2;
  ResizeableBuffer *pRVar3;
  ResizeableBuffer *pRVar4;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> this_00;
  runtime_error *this_01;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_02;
  
  if (this->reader->column_schema->type != (LogicalType)0xa) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"RLE encoding is only supported for boolean data");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_02 = &this->reader->block;
  pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_02);
  ByteBuffer::available(&pRVar3->super_ByteBuffer,4);
  puVar1 = &(pRVar3->super_ByteBuffer).len;
  *puVar1 = *puVar1 - 4;
  (pRVar3->super_ByteBuffer).ptr = (pRVar3->super_ByteBuffer).ptr + 4;
  pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_02);
  pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_02);
  this_00._M_head_impl = (RleBpDecoder *)operator_new(0x40);
  RleBpDecoder::RleBpDecoder
            (this_00._M_head_impl,(pRVar3->super_ByteBuffer).ptr,
             (uint32_t)(pRVar4->super_ByteBuffer).len,1);
  _Var2._M_head_impl =
       (this->rle_decoder).
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  (this->rle_decoder).
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var2._M_head_impl);
    return;
  }
  return;
}

Assistant:

void RLEDecoder::InitializePage() {
	if (reader.Type().id() != LogicalTypeId::BOOLEAN) {
		throw std::runtime_error("RLE encoding is only supported for boolean data");
	}
	auto &block = reader.block;
	block->inc(sizeof(uint32_t));
	rle_decoder = make_uniq<RleBpDecoder>(block->ptr, block->len, 1);
}